

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteMainCMakefile(cmGlobalUnixMakefileGenerator3 *this)

{
  pointer ppcVar1;
  cmake *this_00;
  cmLocalGenerator *pcVar2;
  bool bVar3;
  string *psVar4;
  ostream *poVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  cmGlobalUnixMakefileGenerator3 *this_01;
  string *f;
  pointer ppcVar6;
  pointer pbVar7;
  pointer pbVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lfiles;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range1;
  string tmpStr;
  string currentBinDir;
  string binDir;
  string check;
  string cmakefileName;
  string makefileName;
  cmGeneratedFileStream cmakefileStream;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_378;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *local_360;
  undefined1 local_358 [32];
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  cmGeneratedFileStream local_278;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"CMAKE_SUPPRESS_REGENERATION",(allocator<char> *)&local_2d8);
  bVar3 = cmGlobalGenerator::GlobalSettingIsOn((cmGlobalGenerator *)this,(string *)&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  if (!bVar3) {
    psVar4 = cmake::GetHomeOutputDirectory_abi_cxx11_
                       ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance)
    ;
    std::__cxx11::string::string((string *)&local_2d8,(string *)psVar4);
    std::__cxx11::string::append((char *)&local_2d8);
    std::__cxx11::string::append((char *)&local_2d8);
    cmGeneratedFileStream::cmGeneratedFileStream(&local_278,&local_2d8,false,None);
    if (((&local_278.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
         [*(long *)((long)local_278.super_ofstream.
                          super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream +
                   -0x18)] & 5) == 0) {
      psVar4 = cmake::GetHomeOutputDirectory_abi_cxx11_
                         ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          CMakeInstance);
      std::__cxx11::string::string((string *)&local_2b8,(string *)psVar4);
      std::__cxx11::string::append((char *)&local_2b8);
      cmLocalUnixMakefileGenerator3::WriteDisclaimer
                ((cmLocalUnixMakefileGenerator3 *)
                 *(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_start,(ostream *)&local_278);
      poVar5 = std::operator<<((ostream *)&local_278,"# The generator used is:\n");
      poVar5 = std::operator<<(poVar5,"set(CMAKE_DEPENDS_GENERATOR \"");
      (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[3])
                (&local_338);
      poVar5 = std::operator<<(poVar5,(string *)&local_338);
      std::operator<<(poVar5,"\")\n\n");
      local_360 = &(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators;
      std::__cxx11::string::~string((string *)&local_338);
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      ppcVar1 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppcVar6 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                     super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppcVar6 != ppcVar1;
          ppcVar6 = ppcVar6 + 1) {
        cmAppend<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_378,&(*ppcVar6)->Makefile->ListFiles);
      }
      this_00 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
      bVar3 = cmake::DoWriteGlobVerifyTarget(this_00);
      if (bVar3) {
        psVar4 = cmake::GetGlobVerifyScript_abi_cxx11_(this_00);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_378,psVar4);
        psVar4 = cmake::GetGlobVerifyStamp_abi_cxx11_(this_00);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_378,psVar4);
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::__cxx11::string>>>
                (local_378.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_378.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      __first = std::
                __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                          (local_378.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_378.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(&local_378,(const_iterator)__first._M_current,
              (const_iterator)
              local_378.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
      pcVar2 = *(local_360->
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl
                .super__Vector_impl_data._M_start;
      psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar2);
      std::__cxx11::string::string((string *)&local_338,(string *)psVar4);
      poVar5 = std::operator<<((ostream *)&local_278,
                               "# The top level Makefile was generated from the following files:\n")
      ;
      poVar5 = std::operator<<(poVar5,"set(CMAKE_MAKEFILE_DEPENDS\n");
      std::operator<<(poVar5,"  \"CMakeCache.txt\"\n");
      pbVar8 = local_378.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar7 = local_378.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar8; pbVar7 = pbVar7 + 1
          ) {
        poVar5 = std::operator<<((ostream *)&local_278,"  \"");
        cmLocalGenerator::MaybeConvertToRelativePath(&local_2f8,pcVar2,&local_338,pbVar7);
        poVar5 = std::operator<<(poVar5,(string *)&local_2f8);
        std::operator<<(poVar5,"\"\n");
        std::__cxx11::string::~string((string *)&local_2f8);
      }
      std::operator<<((ostream *)&local_278,"  )\n\n");
      psVar4 = cmake::GetHomeOutputDirectory_abi_cxx11_
                         ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          CMakeInstance);
      std::__cxx11::string::string((string *)&local_2f8,(string *)psVar4);
      std::__cxx11::string::append((char *)&local_2f8);
      std::__cxx11::string::append((char *)&local_2f8);
      poVar5 = std::operator<<((ostream *)&local_278,"# The corresponding makefile is:\n");
      poVar5 = std::operator<<(poVar5,"set(CMAKE_MAKEFILE_OUTPUTS\n");
      poVar5 = std::operator<<(poVar5,"  \"");
      cmLocalGenerator::MaybeConvertToRelativePath(&local_318,pcVar2,&local_338,&local_2b8);
      poVar5 = std::operator<<(poVar5,(string *)&local_318);
      poVar5 = std::operator<<(poVar5,"\"\n");
      poVar5 = std::operator<<(poVar5,"  \"");
      cmLocalGenerator::MaybeConvertToRelativePath((string *)local_358,pcVar2,&local_338,&local_2f8)
      ;
      poVar5 = std::operator<<(poVar5,(string *)local_358);
      std::operator<<(poVar5,"\"\n");
      std::__cxx11::string::~string((string *)local_358);
      std::__cxx11::string::~string((string *)&local_318);
      std::operator<<((ostream *)&local_278,"  )\n\n");
      psVar4 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(pcVar2);
      std::__cxx11::string::string((string *)&local_318,(string *)psVar4);
      poVar5 = std::operator<<((ostream *)&local_278,"# Byproducts of CMake generate step:\n");
      std::operator<<(poVar5,"set(CMAKE_MAKEFILE_PRODUCTS\n");
      pbVar7 = (pcVar2->Makefile->OutputFiles).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar8 = (pcVar2->Makefile->OutputFiles).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar7; pbVar8 = pbVar8 + 1
          ) {
        poVar5 = std::operator<<((ostream *)&local_278,"  \"");
        cmLocalGenerator::MaybeConvertToRelativePath((string *)local_358,pcVar2,&local_318,pbVar8);
        poVar5 = std::operator<<(poVar5,(string *)local_358);
        std::operator<<(poVar5,"\"\n");
        std::__cxx11::string::~string((string *)local_358);
      }
      local_358._0_8_ = local_358 + 0x10;
      local_358._8_8_ = 0.0;
      local_358[0x10] = '\0';
      ppcVar1 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppcVar6 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                     super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppcVar6 != ppcVar1;
          ppcVar6 = ppcVar6 + 1) {
        pcVar2 = *ppcVar6;
        cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar2);
        std::__cxx11::string::_M_assign((string *)local_358);
        std::__cxx11::string::append((char *)local_358);
        std::__cxx11::string::append((char *)local_358);
        poVar5 = std::operator<<((ostream *)&local_278,"  \"");
        cmLocalGenerator::MaybeConvertToRelativePath
                  (&local_298,pcVar2,&local_318,(string *)local_358);
        poVar5 = std::operator<<(poVar5,(string *)&local_298);
        std::operator<<(poVar5,"\"\n");
        std::__cxx11::string::~string((string *)&local_298);
      }
      std::operator<<((ostream *)&local_278,"  )\n\n");
      this_01 = (cmGlobalUnixMakefileGenerator3 *)local_358;
      std::__cxx11::string::~string((string *)this_01);
      WriteMainCMakefileLanguageRules(this_01,&local_278,local_360);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_338);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_378);
      std::__cxx11::string::~string((string *)&local_2b8);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&local_278);
    std::__cxx11::string::~string((string *)&local_2d8);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteMainCMakefile()
{
  if (this->GlobalSettingIsOn("CMAKE_SUPPRESS_REGENERATION")) {
    return;
  }

  // Open the output file.  This should not be copy-if-different
  // because the check-build-system step compares the makefile time to
  // see if the build system must be regenerated.
  std::string cmakefileName =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  cmakefileName += "/CMakeFiles";
  cmakefileName += "/Makefile.cmake";
  cmGeneratedFileStream cmakefileStream(cmakefileName);
  if (!cmakefileStream) {
    return;
  }

  std::string makefileName =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  makefileName += "/Makefile";

  // get a local generator for some useful methods
  cmLocalUnixMakefileGenerator3* lg =
    static_cast<cmLocalUnixMakefileGenerator3*>(this->LocalGenerators[0]);

  // Write the do not edit header.
  lg->WriteDisclaimer(cmakefileStream);

  // Save the generator name
  cmakefileStream << "# The generator used is:\n"
                  << "set(CMAKE_DEPENDS_GENERATOR \"" << this->GetName()
                  << "\")\n\n";

  // for each cmMakefile get its list of dependencies
  std::vector<std::string> lfiles;
  for (cmLocalGenerator* localGen : this->LocalGenerators) {
    // Get the list of files contributing to this generation step.
    cmAppend(lfiles, localGen->GetMakefile()->GetListFiles());
  }

  cmake* cm = this->GetCMakeInstance();
  if (cm->DoWriteGlobVerifyTarget()) {
    lfiles.push_back(cm->GetGlobVerifyScript());
    lfiles.push_back(cm->GetGlobVerifyStamp());
  }

  // Sort the list and remove duplicates.
  std::sort(lfiles.begin(), lfiles.end(), std::less<std::string>());
#if !defined(__VMS) // The Compaq STL on VMS crashes, so accept duplicates.
  std::vector<std::string>::iterator new_end =
    std::unique(lfiles.begin(), lfiles.end());
  lfiles.erase(new_end, lfiles.end());
#endif

  // reset lg to the first makefile
  lg = static_cast<cmLocalUnixMakefileGenerator3*>(this->LocalGenerators[0]);

  std::string currentBinDir = lg->GetCurrentBinaryDirectory();
  // Save the list to the cmake file.
  cmakefileStream
    << "# The top level Makefile was generated from the following files:\n"
    << "set(CMAKE_MAKEFILE_DEPENDS\n"
    << "  \"CMakeCache.txt\"\n";
  for (std::string const& f : lfiles) {
    cmakefileStream << "  \""
                    << lg->MaybeConvertToRelativePath(currentBinDir, f)
                    << "\"\n";
  }
  cmakefileStream << "  )\n\n";

  // Build the path to the cache check file.
  std::string check = this->GetCMakeInstance()->GetHomeOutputDirectory();
  check += "/CMakeFiles";
  check += "/cmake.check_cache";

  // Set the corresponding makefile in the cmake file.
  cmakefileStream << "# The corresponding makefile is:\n"
                  << "set(CMAKE_MAKEFILE_OUTPUTS\n"
                  << "  \""
                  << lg->MaybeConvertToRelativePath(currentBinDir,
                                                    makefileName)
                  << "\"\n"
                  << "  \""
                  << lg->MaybeConvertToRelativePath(currentBinDir, check)
                  << "\"\n";
  cmakefileStream << "  )\n\n";

  const std::string binDir = lg->GetBinaryDirectory();

  // CMake must rerun if a byproduct is missing.
  {
    cmakefileStream << "# Byproducts of CMake generate step:\n"
                    << "set(CMAKE_MAKEFILE_PRODUCTS\n";
    for (std::string const& outfile : lg->GetMakefile()->GetOutputFiles()) {
      cmakefileStream << "  \""
                      << lg->MaybeConvertToRelativePath(binDir, outfile)
                      << "\"\n";
    }

    // add in all the directory information files
    std::string tmpStr;
    for (cmLocalGenerator* localGen : this->LocalGenerators) {
      lg = static_cast<cmLocalUnixMakefileGenerator3*>(localGen);
      tmpStr = lg->GetCurrentBinaryDirectory();
      tmpStr += "/CMakeFiles";
      tmpStr += "/CMakeDirectoryInformation.cmake";
      cmakefileStream << "  \""
                      << lg->MaybeConvertToRelativePath(binDir, tmpStr)
                      << "\"\n";
    }
    cmakefileStream << "  )\n\n";
  }

  this->WriteMainCMakefileLanguageRules(cmakefileStream,
                                        this->LocalGenerators);
}